

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O3

Abc_Cex_t * Gia_Sim2GenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  void *__ptr;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  pAVar3 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  iVar8 = pAVar3->nRegs;
  __ptr = malloc((long)nWords << 2);
  if (-1 < iFrame) {
    iVar1 = pAig->nRegs;
    pVVar4 = pAig->vCis;
    iVar5 = 0;
    do {
      if (iVar1 < pVVar4->nSize) {
        iVar6 = 0;
        do {
          lVar7 = (ulong)(uint)nWords + 1;
          if (0 < nWords) {
            do {
              uVar2 = Gia_ManRandom(0);
              *(uint *)((long)__ptr + lVar7 * 4 + -8) = uVar2;
              lVar7 = lVar7 + -1;
            } while (1 < lVar7);
          }
          if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
            (&pAVar3[1].iPo)[iVar6 + iVar8 >> 5] =
                 (&pAVar3[1].iPo)[iVar6 + iVar8 >> 5] | 1 << ((byte)(iVar6 + iVar8) & 0x1f);
          }
          iVar6 = iVar6 + 1;
          iVar1 = pAig->nRegs;
          pVVar4 = pAig->vCis;
        } while (iVar6 < pVVar4->nSize - iVar1);
      }
      iVar8 = iVar8 + pAVar3->nPis;
      bVar9 = iVar5 != iFrame;
      iVar5 = iVar5 + 1;
    } while (bVar9);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_Sim2GenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + i );
    }
    ABC_FREE( pData );
    return p;
}